

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_moveout_ppc(uc_struct_conflict10 *uc,MemoryRegion *mr)

{
  uc_invalidate_tb_t_conflict10 p_Var1;
  uint64_t uVar2;
  undefined1 a [16];
  Int128 IVar3;
  undefined8 unaff_RBX;
  hwaddr hVar4;
  MemoryRegion *mr_00;
  MemoryRegion *mr_local;
  
  mr_00 = (mr->subregions).tqh_first;
  mr_local = mr;
  if (uc->cpu != (CPUState_conflict *)0x0) {
    p_Var1 = uc->uc_invalidate_tb;
    uVar2 = mr->addr;
    IVar3 = mr->size;
    a._8_8_ = unaff_RBX;
    a._0_8_ = mr;
    int128_get64((Int128)a);
    (*p_Var1)(uc,uVar2,(size_t)IVar3);
    for (hVar4 = mr->addr; mr->end != hVar4 && -1 < (long)(mr->end - hVar4);
        hVar4 = hVar4 + uc->target_page_size) {
      tlb_flush_page_ppc(uc->cpu,(target_ulong_conflict)hVar4);
    }
  }
  if (mr_00 == (MemoryRegion *)0x0) {
    mr_00 = mr;
  }
  memory_region_del_subregion_ppc(uc->system_memory,mr);
  g_array_append_vals(uc->unmapped_regions,&mr_local,1);
  memory_region_remove_mapped_block(uc,mr_00,false);
  uc->memory_region_update_pending = true;
  memory_region_transaction_commit_ppc(uc->system_memory);
  mr_local->container = (MemoryRegion *)(long)uc->snapshot_level;
  return;
}

Assistant:

void memory_moveout(struct uc_struct *uc, MemoryRegion *mr)
{
    hwaddr addr;
    /* A bit dirty, but it works.
     * The first subregion will be the one with the smalest priority.
     * In case of CoW this will always be the region which is mapped initial and later be moved in the subregion of the container.
     * The initial subregion is the one stored in mapped_blocks
     * Because CoW is done after the snapshot level is increased there is only on subregion with 
     */
    memory_region_transaction_begin();
    MemoryRegion *mr_block = QTAILQ_FIRST(&mr->subregions);

    if (!mr_block) {
        mr_block = mr;
    }

    if (uc->cpu) {
        // We also need to remove all tb cache
        uc->uc_invalidate_tb(uc, mr->addr, int128_get64(mr->size));

        // Make sure all pages associated with the MemoryRegion are flushed
        // Only need to do this if we are in a running state
        for (addr = mr->addr; (int64_t)(mr->end - addr) > 0; addr += uc->target_page_size) {
           tlb_flush_page(uc->cpu, addr);
        }
    }

    memory_region_del_subregion(uc->system_memory, mr);
    g_array_append_val(uc->unmapped_regions, mr);
    memory_region_remove_mapped_block(uc, mr_block, false);
    uc->memory_region_update_pending = true;
    memory_region_transaction_commit(uc->system_memory);
    /* dirty hack to save the snapshot level */
    mr->container = (void *)(intptr_t)uc->snapshot_level;
}